

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O3

bool TestAPI(void)

{
  ostringstream *this;
  MauResult MVar1;
  int iVar2;
  OutputWorker *this_00;
  int *piVar3;
  MauProxy proxy;
  MauProxy local_210;
  MauChannelConfig local_204;
  undefined1 local_1c8 [48];
  undefined1 local_198 [392];
  
  local_204.Router_MBPS = 1.0;
  local_204.Router_QueueMsec = 100;
  local_204.Router_RED_Enable = true;
  local_1c8._16_4_ = 0x5dc;
  local_204.Router_RED_QueueFraction = 0.5;
  local_204.Router_RED_MaxPLR = 0.02;
  local_204.ReorderMaximumLatencyMsec = 0x96;
  local_204.ReorderRate = 0.005;
  local_204.OrderRate = 0.3;
  local_204.DuplicateRate = 0.001;
  local_204.CorruptionRate = 0.001;
  local_204.LightSpeedMsec = 100;
  local_204.ReorderMinimumLatencyMsec = 0x32;
  local_204.LossRate = 0.05;
  local_204.DeliveryRate = 0.5;
  local_1c8._24_16_ = ZEXT816(0) << 0x20;
  local_204.RNGSeed = 1;
  local_1c8._0_4_ = 3;
  local_1c8._4_4_ = 64000;
  local_1c8._8_4_ = 64000;
  local_1c8._12_4_ = 0x27d8;
  MVar1 = mau_proxy_create((MauProxyConfig *)local_1c8,&local_204,"localhost",0x13c4,&local_210);
  if (MVar1 == Mau_Success) {
    local_198._0_8_ = (char *)0x1;
    local_198._8_8_ = 0;
    do {
      iVar2 = nanosleep((timespec *)local_198,(timespec *)local_198);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    mau_proxy_config(local_210,&local_204);
    local_198._0_8_ = (char *)0x1;
    local_198._8_8_ = 0;
    do {
      iVar2 = nanosleep((timespec *)local_198,(timespec *)local_198);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    mau_proxy_destroy(local_210);
  }
  else if ((int)Logger.ChannelMinLevel < 5) {
    this = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = Logger.ChannelName;
    local_198._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"mau_proxy_destroy failed: ",0x1a);
    std::ostream::operator<<((ostream *)this,MVar1);
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  return MVar1 == Mau_Success;
}

Assistant:

bool TestAPI()
{
    MauChannelConfig channel;
    channel.LightSpeedMsec = 100;
    channel.LossRate = 0.05f;
    channel.RNGSeed = 1;
    MauProxyConfig config;
    config.UDPListenPort = 10200;
    const char* hostname = "localhost";
    uint16_t port = 5060;
    MauProxy proxy;
    MauResult createResult = mau_proxy_create(
        &config,
        &channel,
        hostname,
        port,
        &proxy
    );
    if (MAU_FAILED(createResult))
    {
        Logger.Error("mau_proxy_destroy failed: ", createResult);
        return false;
    }

#ifdef MAU_SIMPLE_PROXY
    Logger.Debug("Press ENTER key to stop client");
    ::getchar();
    Logger.Debug("...Key press detected.  Stopping..");
#else
    std::this_thread::sleep_for(std::chrono::milliseconds(1000));

    // Example reconfigure route settings during use
    mau_proxy_config(
        proxy,
        &channel
    );

    std::this_thread::sleep_for(std::chrono::milliseconds(1000));
#endif

    MauResult destroyResult = mau_proxy_destroy(
        proxy
    );
    if (MAU_FAILED(createResult))
    {
        Logger.Error("mau_proxy_destroy failed: ", destroyResult);
        return false;
    }

    return true;
}